

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O0

Int __thiscall
ipx::LpSolver::GetBasicSolution
          (LpSolver *this,double *x,double *slack,double *y,double *z,Int *cbasis,Int *vbasis)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> *in_RDI;
  Int *in_stack_00000068;
  Int *in_stack_00000070;
  vector<int,_std::allocator<int>_> *in_stack_00000078;
  Model *in_stack_00000080;
  double *in_stack_000000e8;
  vector<int,_std::allocator<int>_> *in_stack_000000f0;
  Vector *in_stack_000000f8;
  Vector *in_stack_00000100;
  Vector *in_stack_00000108;
  Model *in_stack_00000110;
  double *in_stack_00000120;
  double *in_stack_00000128;
  double *in_stack_00000130;
  undefined4 local_4;
  
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_RDI);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    Model::PostsolveBasicSolution
              (in_stack_00000110,in_stack_00000108,in_stack_00000100,in_stack_000000f8,
               in_stack_000000f0,in_stack_000000e8,in_stack_00000120,in_stack_00000128,
               in_stack_00000130);
    Model::PostsolveBasis(in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

Int LpSolver::GetBasicSolution(double* x, double* slack, double* y, double* z,
                               Int* cbasis, Int* vbasis) const {
    if (basic_statuses_.empty())
        return -1;
    model_.PostsolveBasicSolution(x_crossover_, y_crossover_, z_crossover_,
                                  basic_statuses_, x, slack, y, z);
    model_.PostsolveBasis(basic_statuses_, cbasis, vbasis);
    return 0;
}